

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandMfs2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *pVVar6;
  char *pcVar7;
  char *pcVar8;
  uint local_c0;
  Sfm_Par_t Pars;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Sfm_ParSetDefault(&Pars);
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  local_c0 = 0;
LAB_00221ff2:
  iVar3 = Extra_UtilGetopt(argc,argv,"WFDMLCZNIdaeijvwh");
  iVar5 = globalUtilOptind;
  switch(iVar3) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_002222f9:
      Abc_Print(-1,pcVar7);
      goto switchD_0022201d_caseD_62;
    }
    uVar4 = atoi(argv[globalUtilOptind]);
    Pars.nBTLimit = uVar4;
    break;
  case 0x44:
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-D\" should be followed by an integer.\n";
      goto LAB_002222f9;
    }
    uVar4 = atoi(argv[globalUtilOptind]);
    Pars.nDepthMax = uVar4;
    break;
  case 0x45:
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
    goto switchD_0022201d_caseD_62;
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-F\" should be followed by an integer.\n";
      goto LAB_002222f9;
    }
    uVar4 = atoi(argv[globalUtilOptind]);
    Pars.nFanoutMax = uVar4;
    break;
  case 0x49:
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-I\" should be followed by an integer.\n";
      goto LAB_002222f9;
    }
    uVar4 = atoi(argv[globalUtilOptind]);
    local_c0 = uVar4;
    break;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-L\" should be followed by an integer.\n";
      goto LAB_002222f9;
    }
    Pars.nGrowthLevel = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if (Pars.nGrowthLevel + 0xc46535ffU < 0x88ca6bff) {
switchD_0022201d_caseD_62:
      iVar5 = -2;
      Abc_Print(-2,"usage: mfs2 [-WFDMLCZNI <num>] [-daeijvwh]\n");
      Abc_Print(-2,"\t           performs don\'t-care-based optimization of logic networks\n");
      Abc_Print(-2,"\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",
                (ulong)(uint)Pars.nTfoLevMax);
      Abc_Print(-2,"\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",
                (ulong)(uint)Pars.nFanoutMax);
      Abc_Print(-2,"\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n",
                (ulong)(uint)Pars.nDepthMax);
      Abc_Print(-2,
                "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)Pars.nWinSizeMax);
      Abc_Print(-2,
                "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n"
                ,(ulong)(uint)Pars.nGrowthLevel);
      Abc_Print(-2,
                "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)Pars.nBTLimit);
      Abc_Print(-2,
                "\t-Z <num> : treat the first <num> logic nodes as fixed (0 = none) [default = %d]\n"
                ,(ulong)(uint)Pars.nFirstFixed);
      Abc_Print(-2,"\t-N <num> : the max number of nodes to try (0 = all) [default = %d]\n",
                (ulong)(uint)Pars.nNodesMax);
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (Pars.fRrOnly == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-d       : toggle performing redundancy removal [default = %s]\n",pcVar7);
      pcVar7 = "area";
      if (Pars.fArea == 0) {
        pcVar7 = "area+edges";
      }
      Abc_Print(-2,"\t-a       : toggle minimizing area or area+edges [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (Pars.fMoreEffort == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-e       : toggle high-effort resubstitution [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (!bVar1) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-i       : toggle using inductive don\'t-cares [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (!bVar2) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-j       : toggle using all flops when \"-i\" is enabled [default = %s]\n",
                pcVar7);
      Abc_Print(-2,"\t-I       : the number of additional frames inserted [default = %d]\n",
                (ulong)local_c0);
      pcVar7 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar7);
      if (Pars.fVeryVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",
                pcVar8);
      pcVar7 = "\t-h       : print the command usage\n";
LAB_002224c6:
      Abc_Print(iVar5,pcVar7);
      return 1;
    }
    goto LAB_00221ff2;
  case 0x4d:
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-M\" should be followed by an integer.\n";
      goto LAB_002222f9;
    }
    uVar4 = atoi(argv[globalUtilOptind]);
    Pars.nWinSizeMax = uVar4;
    break;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-N\" should be followed by an integer.\n";
      goto LAB_002222f9;
    }
    uVar4 = atoi(argv[globalUtilOptind]);
    Pars.nNodesMax = uVar4;
    break;
  default:
    switch(iVar3) {
    case 0x61:
      Pars.fArea = Pars.fArea ^ 1;
      goto LAB_00221ff2;
    case 0x62:
    case 99:
    case 0x66:
    case 0x67:
    case 0x68:
      goto switchD_0022201d_caseD_62;
    case 100:
      Pars.fRrOnly = Pars.fRrOnly ^ 1;
      goto LAB_00221ff2;
    case 0x65:
      Pars.fMoreEffort = Pars.fMoreEffort ^ 1;
      goto LAB_00221ff2;
    case 0x69:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_00221ff2;
    case 0x6a:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_00221ff2;
    default:
      if (iVar3 == 0x57) {
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-W\" should be followed by an integer.\n";
          goto LAB_002222f9;
        }
        uVar4 = atoi(argv[globalUtilOptind]);
        Pars.nTfoLevMax = uVar4;
      }
      else {
        if (iVar3 != 0x5a) {
          if (iVar3 == 0x76) {
            Pars.fVerbose = Pars.fVerbose ^ 1;
          }
          else {
            if (iVar3 != 0x77) {
              if (iVar3 == -1) {
                if (pNtk == (Abc_Ntk_t *)0x0) {
                  pcVar7 = "Empty network.\n";
                }
                else if (pNtk->ntkType == ABC_NTK_LOGIC) {
                  if (bVar1) {
                    if (bVar2) {
                      pAbc->nIndFrames = 1;
                      Vec_IntFreeP(&pAbc->vIndFlops);
                      pVVar6 = Vec_IntAlloc(pNtk->nObjCounts[8]);
                      pAbc->vIndFlops = pVVar6;
                      Vec_IntFill(pVVar6,pNtk->nObjCounts[8],1);
                    }
                    if (pAbc->nIndFrames < 1) {
                      pcVar7 = "The number of k-inductive frames is not specified.\n";
LAB_00222525:
                      Abc_Print(-1,pcVar7);
                      return 0;
                    }
                    pVVar6 = pAbc->vIndFlops;
                    if (pVVar6 == (Vec_Int_t *)0x0) {
                      pcVar7 = "The set of k-inductive flops is not specified.\n";
                      goto LAB_00222525;
                    }
                    if (pVVar6->nSize != pNtk->nObjCounts[8]) {
                      Abc_Print(-1,
                                "The saved flop count (%d) does not match that of the current network (%d).\n"
                                ,(ulong)(uint)pVVar6->nSize,(ulong)(uint)pNtk->nObjCounts[8]);
                      return 0;
                    }
                    iVar5 = Abc_NtkMfsAfterICheck(pNtk,pAbc->nIndFrames,local_c0,pVVar6,&Pars);
                    if (iVar5 != 0) {
                      if (!bVar2) {
                        return 0;
                      }
                      pAbc->nIndFrames = 0;
                      Vec_IntFreeP(&pAbc->vIndFlops);
                      return 0;
                    }
                  }
                  else {
                    iVar5 = Abc_NtkPerformMfs(pNtk,&Pars);
                    if (iVar5 != 0) {
                      return 0;
                    }
                  }
                  pcVar7 = "Resynthesis has failed.\n";
                }
                else {
                  pcVar7 = "This command can only be applied to a logic network.\n";
                }
                iVar5 = -1;
                goto LAB_002224c6;
              }
              goto switchD_0022201d_caseD_62;
            }
            Pars.fVeryVerbose = Pars.fVeryVerbose ^ 1;
          }
          goto LAB_00221ff2;
        }
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-Z\" should be followed by an integer.\n";
          goto LAB_002222f9;
        }
        uVar4 = atoi(argv[globalUtilOptind]);
        Pars.nFirstFixed = uVar4;
      }
    }
  }
  globalUtilOptind = iVar5 + 1;
  if ((int)uVar4 < 0) goto switchD_0022201d_caseD_62;
  goto LAB_00221ff2;
}

Assistant:

int Abc_CommandMfs2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkPerformMfs( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars );
    extern int Abc_NtkMfsAfterICheck( Abc_Ntk_t * p, int nFrames, int nFramesAdd, Vec_Int_t * vFlops, Sfm_Par_t * pPars );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Sfm_Par_t Pars, * pPars = &Pars;
    int c, fIndDCs = 0, fUseAllFfs = 0, nFramesAdd = 0;
    // set defaults
    Sfm_ParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WFDMLCZNIdaeijvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfoLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfoLevMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFanoutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFanoutMax < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDepthMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDepthMax < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinSizeMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nGrowthLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGrowthLevel < -ABC_INFINITY || pPars->nGrowthLevel > ABC_INFINITY )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'Z':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Z\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFirstFixed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFirstFixed < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodesMax < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesAdd < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fRrOnly ^= 1;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'e':
            pPars->fMoreEffort ^= 1;
            break;
        case 'i':
            fIndDCs ^= 1;
            break;
        case 'j':
            fUseAllFfs ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    if ( fIndDCs )
    {
        if ( fUseAllFfs )
        {
            pAbc->nIndFrames = 1;
            Vec_IntFreeP( &pAbc->vIndFlops );
            pAbc->vIndFlops = Vec_IntAlloc( Abc_NtkLatchNum(pNtk) );
            Vec_IntFill( pAbc->vIndFlops, Abc_NtkLatchNum(pNtk), 1 );
        }
        if ( pAbc->nIndFrames <= 0 )
        {
            Abc_Print( -1, "The number of k-inductive frames is not specified.\n" );
            return 0;
        }
        if ( pAbc->vIndFlops == NULL )
        {
            Abc_Print( -1, "The set of k-inductive flops is not specified.\n" );
            return 0;
        }
        if ( Vec_IntSize(pAbc->vIndFlops) != Abc_NtkLatchNum(pNtk) )
        {
            Abc_Print( -1, "The saved flop count (%d) does not match that of the current network (%d).\n",
                Vec_IntSize(pAbc->vIndFlops), Abc_NtkLatchNum(pNtk) );
            return 0;
        }
        // modify the current network
        if ( !Abc_NtkMfsAfterICheck( pNtk, pAbc->nIndFrames, nFramesAdd, pAbc->vIndFlops, pPars ) )
        {
            Abc_Print( -1, "Resynthesis has failed.\n" );
            return 1;
        }
        if ( fUseAllFfs )
        {
            pAbc->nIndFrames = 0;
            Vec_IntFreeP( &pAbc->vIndFlops );
        }
    }
    else
    {
        // modify the current network
        if ( !Abc_NtkPerformMfs( pNtk, pPars ) )
        {
            Abc_Print( -1, "Resynthesis has failed.\n" );
            return 1;
        }
    }
    return 0;

usage:
    Abc_Print( -2, "usage: mfs2 [-WFDMLCZNI <num>] [-daeijvwh]\n" );
    Abc_Print( -2, "\t           performs don't-care-based optimization of logic networks\n" );
    Abc_Print( -2, "\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",             pPars->nTfoLevMax );
    Abc_Print( -2, "\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",                pPars->nFanoutMax );
    Abc_Print( -2, "\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n",                   pPars->nDepthMax );
    Abc_Print( -2, "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n",    pPars->nWinSizeMax );
    Abc_Print( -2, "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n", pPars->nGrowthLevel );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n",   pPars->nBTLimit );
    Abc_Print( -2, "\t-Z <num> : treat the first <num> logic nodes as fixed (0 = none) [default = %d]\n",       pPars->nFirstFixed );
    Abc_Print( -2, "\t-N <num> : the max number of nodes to try (0 = all) [default = %d]\n",                    pPars->nNodesMax );
    Abc_Print( -2, "\t-d       : toggle performing redundancy removal [default = %s]\n",                        pPars->fRrOnly? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggle minimizing area or area+edges [default = %s]\n",                        pPars->fArea? "area": "area+edges" );
    Abc_Print( -2, "\t-e       : toggle high-effort resubstitution [default = %s]\n",                           pPars->fMoreEffort? "yes": "no" );
    Abc_Print( -2, "\t-i       : toggle using inductive don't-cares [default = %s]\n",                          fIndDCs? "yes": "no" );
    Abc_Print( -2, "\t-j       : toggle using all flops when \"-i\" is enabled [default = %s]\n",               fUseAllFfs? "yes": "no" );
    Abc_Print( -2, "\t-I       : the number of additional frames inserted [default = %d]\n",                    nFramesAdd );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n",                        pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n",                pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}